

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

void __thiscall
sptk::reaper::EpochTracker::HilbertTransform
          (EpochTracker *this,int16_t *input,int32_t n_input,float *output)

{
  size_t __n;
  float fVar1;
  uint uVar2;
  float *x;
  float *y;
  int power;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  FFT ft;
  FFT local_50;
  
  power = 0;
  do {
    power = power + 1;
  } while (1 << ((byte)power & 0x1f) < n_input);
  FFT::FFT(&local_50,power);
  uVar5 = (ulong)local_50.fftSize;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)uVar5) {
    uVar4 = uVar5 * 4;
  }
  x = (float *)operator_new__(uVar4);
  y = (float *)operator_new__(uVar4);
  uVar4 = (ulong)(uint)n_input;
  if (0 < n_input) {
    uVar6 = 0;
    memset(y,0,uVar4 * 4);
    do {
      x[uVar6] = (float)(int)input[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (n_input < local_50.fftSize) {
    __n = (ulong)(uint)(~n_input + local_50.fftSize) * 4 + 4;
    memset(x + n_input,0,__n);
    memset(y + n_input,0,__n);
  }
  FFT::fft(&local_50,x,y);
  uVar2 = (int)(((uint)(uVar5 >> 0x1f) & 1) + local_50.fftSize) >> 1;
  if (3 < local_50.fftSize) {
    uVar6 = 2;
    if (2 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    uVar3 = 1;
    do {
      fVar1 = y[uVar3];
      y[uVar3] = -x[uVar3];
      x[uVar3] = fVar1;
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  *y = 0.0;
  *x = 0.0;
  if ((int)(uVar2 + 1) < local_50.fftSize) {
    uVar6 = (ulong)(int)(uVar2 + 1);
    do {
      fVar1 = y[uVar6];
      y[uVar6] = x[uVar6];
      x[uVar6] = -fVar1;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  FFT::ifft(&local_50,x,y);
  if (0 < n_input) {
    uVar5 = 0;
    do {
      output[uVar5] = x[uVar5] / (float)local_50.fftSize;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  operator_delete__(x);
  operator_delete__(y);
  FFT::~FFT(&local_50);
  return;
}

Assistant:

void EpochTracker::HilbertTransform(int16_t* input, int32_t n_input,
                                    float* output) {
  FFT ft = FFT(FFT::fft_pow2_from_window_size(n_input));
  int32_t n_fft = ft.get_fftSize();
  float* re = new float[n_fft];
  float* im = new float[n_fft];
  for (int i = 0; i < n_input; ++i) {
    re[i] = input[i];
    im[i] = 0.0;
  }
  for (int i = n_input; i < n_fft; ++i) {
    re[i] = 0.0;
    im[i] = 0.0;
  }
  ft.fft(re, im);
  for (int i = 1; i < n_fft/2; ++i) {
    float tmp = im[i];
    im[i] = -re[i];
    re[i] = tmp;
  }
  re[0] = im[0] = 0.0;
  for (int i = n_fft/2 + 1; i < n_fft; ++i) {
    float tmp = im[i];
    im[i] = re[i];
    re[i] = -tmp;
  }
  ft.ifft(re, im);
  for (int i = 0; i < n_input; ++i) {
    output[i] = re[i] / n_fft;
  }
  delete [] re;
  delete [] im;
}